

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

bool __thiscall
binlog::PrettyPrinter::printStruct
          (PrettyPrinter *this,OstreamBuffer *out,StructBegin sb,Range *input)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  unsigned_long v;
  nanoseconds sinceEpoch;
  long v_00;
  size_t __n;
  pointer tzname;
  char *pcVar4;
  char *__buf;
  string_view y;
  string_view y_00;
  string_view y_01;
  string_view sVar5;
  string_view y_02;
  string_view y_03;
  string_view y_04;
  string_view y_05;
  string_view y_06;
  string_view y_07;
  string_view y_08;
  string_view y_09;
  string_view x;
  string_view x_00;
  string_view x_01;
  string_view x_02;
  string_view x_03;
  string_view x_04;
  string_view x_05;
  IntegerToHex tohex;
  
  sVar5 = sb.name;
  y._len = 0xf;
  y._ptr = "binlog::address";
  bVar1 = mserialize::operator==(sb.name,y);
  if (bVar1) {
    __n = 8;
    y_00._len = 8;
    y_00._ptr = "`value\'L";
    bVar1 = mserialize::operator==(sb.tag,y_00);
    if (bVar1) {
      v = Range::read<unsigned_long>(input);
      tohex._p = tohex._buffer + 0x13;
      mserialize::detail::IntegerToHex::visit<unsigned_long>(&tohex,v);
      out = detail::OstreamBuffer::operator<<(out,"0x");
      __buf = tohex._buffer + 0x13 + -(long)tohex._p;
      pcVar4 = tohex._p;
      goto LAB_00188547;
    }
  }
  y_01._len = 0x25;
  y_01._ptr = "std::chrono::system_clock::time_point";
  bVar1 = mserialize::operator==(sVar5,y_01);
  if ((bVar1) &&
     (sVar5._len = 5, sVar5._ptr = "`ns\'l", bVar1 = mserialize::operator==(sb.tag,sVar5), bVar1)) {
    if (this->_clockSync != (ClockSync *)0x0) {
      tohex._buffer[0x10] = '\0';
      tohex._buffer[0x11] = '\0';
      tohex._buffer[0x12] = '\0';
      tohex._buffer[0x13] = '\0';
      tohex._20_4_ = 0;
      tohex._p = (char *)0x0;
      tohex._buffer[0] = '\0';
      tohex._buffer[1] = '\0';
      tohex._buffer[2] = '\0';
      tohex._buffer[3] = '\0';
      tohex._buffer[4] = '\0';
      tohex._buffer[5] = '\0';
      tohex._buffer[6] = '\0';
      tohex._buffer[7] = '\0';
      tohex._buffer[8] = '\0';
      tohex._buffer[9] = '\0';
      tohex._buffer[10] = '\0';
      tohex._buffer[0xb] = '\0';
      tohex._buffer[0xc] = '\0';
      tohex._buffer[0xd] = '\0';
      tohex._buffer[0xe] = '\0';
      tohex._buffer[0xf] = '\0';
      sinceEpoch.__r = Range::read<long>(input);
      if (this->_useLocaltime == true) {
        nsSinceEpochToBrokenDownTimeUTC
                  ((nanoseconds)((long)this->_clockSync->tzOffset * 1000000000 + sinceEpoch.__r),
                   (BrokenDownTime *)&tohex);
        iVar2 = this->_clockSync->tzOffset;
        tzname = (this->_clockSync->tzName)._M_dataplus._M_p;
      }
      else {
        nsSinceEpochToBrokenDownTimeUTC(sinceEpoch,(BrokenDownTime *)&tohex);
        tzname = "UTC";
        iVar2 = 0;
      }
      printTime(this,out,(BrokenDownTime *)&tohex,iVar2,tzname);
      return true;
    }
    return false;
  }
  x._len = 0x1a;
  x._ptr = "std::chrono::duration<Rep,";
  bVar1 = mserialize::string_view::starts_with(&sb.name,x);
  if (bVar1) {
    x_00._len = 10;
    x_00._ptr = "std::nano>";
    bVar1 = mserialize::string_view::ends_with(&sb.name,x_00);
    if (bVar1) {
      pcVar4 = "ns";
    }
    else {
      x_01._len = 0xb;
      x_01._ptr = "std::micro>";
      bVar1 = mserialize::string_view::ends_with(&sb.name,x_01);
      if (bVar1) {
        pcVar4 = "us";
      }
      else {
        x_02._len = 0xb;
        x_02._ptr = "std::milli>";
        bVar1 = mserialize::string_view::ends_with(&sb.name,x_02);
        if (bVar1) {
          pcVar4 = "ms";
        }
        else {
          x_03._len = 0xe;
          x_03._ptr = "std::ratio<1>>";
          bVar1 = mserialize::string_view::ends_with(&sb.name,x_03);
          if (bVar1) {
            pcVar4 = "s";
          }
          else {
            x_04._len = 0xf;
            x_04._ptr = "std::ratio<60>>";
            bVar1 = mserialize::string_view::ends_with(&sb.name,x_04);
            if (bVar1) {
              pcVar4 = "m";
            }
            else {
              x_05._len = 0x11;
              x_05._ptr = "std::ratio<3600>>";
              bVar1 = mserialize::string_view::ends_with(&sb.name,x_05);
              if (!bVar1) goto LAB_00188489;
              pcVar4 = "h";
            }
          }
        }
      }
    }
    y_02._len = 8;
    y_02._ptr = "`count\'l";
    bVar1 = mserialize::operator==(sb.tag,y_02);
    if (bVar1) {
      v_00 = Range::read<long>(input);
      detail::OstreamBuffer::writeSigned(out,v_00);
LAB_0018847c:
      detail::OstreamBuffer::operator<<(out,pcVar4);
      return true;
    }
    y_03._len = 8;
    y_03._ptr = "`count\'i";
    bVar1 = mserialize::operator==(sb.tag,y_03);
    if (bVar1) {
      iVar2 = Range::read<int>(input);
      out = detail::OstreamBuffer::operator<<(out,iVar2);
      goto LAB_0018847c;
    }
  }
LAB_00188489:
  y_04._len = 0x15;
  y_04._ptr = "std::filesystem::path";
  bVar1 = mserialize::operator==(sb.name,y_04);
  if (bVar1) {
    __n = 7;
    y_05._len = 7;
    y_05._ptr = "`str\'[c";
    bVar1 = mserialize::operator==(sb.tag,y_05);
    if (!bVar1) goto LAB_001884be;
  }
  else {
LAB_001884be:
    y_06._len = 0x20;
    y_06._ptr = "std::filesystem::directory_entry";
    bVar1 = mserialize::operator==(sb.name,y_06);
    if (bVar1) {
      __n = 0x24;
      y_07._len = 0x24;
      y_07._ptr = "`path\'{std::filesystem::path`str\'[c}";
      bVar1 = mserialize::operator==(sb.tag,y_07);
      if (bVar1) goto LAB_00188528;
    }
    y_08._len = 0xf;
    y_08._ptr = "std::error_code";
    bVar1 = mserialize::operator==(sb.name,y_08);
    if (!bVar1) {
      return false;
    }
    __n = 0xb;
    y_09._len = 0xb;
    y_09._ptr = "`message\'[c";
    bVar1 = mserialize::operator==(sb.tag,y_09);
    if (!bVar1) {
      return false;
    }
  }
LAB_00188528:
  uVar3 = Range::read<unsigned_int>(input);
  __buf = (char *)(ulong)uVar3;
  pcVar4 = Range::view(input,(size_t)__buf);
LAB_00188547:
  detail::OstreamBuffer::write(out,(int)pcVar4,__buf,__n);
  return true;
}

Assistant:

bool PrettyPrinter::printStruct(detail::OstreamBuffer& out, mserialize::Visitor::StructBegin sb, Range& input) const
{
  if (sb.name == "binlog::address" && sb.tag == "`value'L")
  {
    const std::uint64_t value = input.read<std::uint64_t>();
    mserialize::detail::IntegerToHex tohex;
    tohex.visit(value);
    out << "0x" << tohex.value();
    return true;
  }

  if (sb.name == "std::chrono::system_clock::time_point" && sb.tag == "`ns'l")
  {
    if (_clockSync == nullptr) { return false; }

    BrokenDownTime bdt{};
    const auto sinceEpoch = std::chrono::nanoseconds{input.read<std::int64_t>()};

    if (_useLocaltime)
    {
      const std::chrono::nanoseconds sinceEpochTz = sinceEpoch + std::chrono::seconds{_clockSync->tzOffset};
      nsSinceEpochToBrokenDownTimeUTC(sinceEpochTz, bdt);
      printTime(out, bdt, _clockSync->tzOffset, _clockSync->tzName.data());
    }
    else
    {
      nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
      printTime(out, bdt, 0, "UTC");
    }
    return true;
  }

  if (sb.name.starts_with("std::chrono::duration<Rep,"))
  {
    const char* suffix =
      sb.name.ends_with("std::nano>") ? "ns" :
      sb.name.ends_with("std::micro>") ? "us" :
      sb.name.ends_with("std::milli>") ? "ms" :
      sb.name.ends_with("std::ratio<1>>") ? "s" :
      sb.name.ends_with("std::ratio<60>>") ? "m" :
      sb.name.ends_with("std::ratio<3600>>") ? "h" :
      nullptr;
    if (suffix != nullptr)
    {
      if (sb.tag == "`count'l")
      {
        const std::int64_t count = input.read<std::int64_t>();
        out << count << suffix;
        return true;
      }
      if (sb.tag == "`count'i") // on MSVC, for minutes and hours
      {
        const std::int32_t count = input.read<std::int32_t>();
        out << count << suffix;
        return true;
      }
    }
  }

  if ((sb.name == "std::filesystem::path" && sb.tag == "`str'[c")
  || (sb.name == "std::filesystem::directory_entry" && sb.tag == "`path'{std::filesystem::path`str'[c}")
  || (sb.name == "std::error_code" && sb.tag == "`message'[c")
  ) {
    const std::uint32_t size = input.read<std::uint32_t>();
    out.write(input.view(size), size);
    return true;
  }

  return false;
}